

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O0

void __thiscall MxxImpl_CustomOp_Test::TestBody(MxxImpl_CustomOp_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_790;
  Message local_788;
  MPI_Op local_780;
  ompi_op_t *local_778;
  undefined1 local_770 [8];
  AssertionResult gtest_ar_21;
  Message local_758;
  MPI_Datatype local_750;
  ompi_datatype_t *local_748;
  undefined1 local_740 [8];
  AssertionResult gtest_ar_20;
  undefined1 local_728 [8];
  custom_op<int,_true> o_10;
  min<int> x_8;
  Message local_6d8;
  MPI_Op local_6d0;
  ompi_op_t *local_6c8;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar_19;
  Message local_6a8;
  MPI_Datatype local_6a0;
  ompi_datatype_t *local_698;
  undefined1 local_690 [8];
  AssertionResult gtest_ar_18;
  undefined1 local_678 [8];
  custom_op<int,_true> o_9;
  max<int> x_7;
  Message local_628;
  MPI_Op local_620;
  ompi_op_t *local_618;
  undefined1 local_610 [8];
  AssertionResult gtest_ar_17;
  Message local_5f8;
  MPI_Datatype local_5f0;
  ompi_datatype_t *local_5e8;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar_16;
  custom_op<int,_true> o_8;
  Message local_588;
  MPI_Op local_580;
  ompi_op_t *local_578;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_15;
  Message local_558;
  MPI_Datatype local_550;
  ompi_datatype_t *local_548;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_14;
  custom_op<float,_true> o_7;
  Message local_4e8;
  MPI_Op local_4e0;
  ompi_op_t *local_4d8;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_13;
  Message local_4b8;
  MPI_Datatype local_4b0;
  ompi_datatype_t *local_4a8;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_12;
  undefined1 local_488 [8];
  custom_op<unsigned_short,_true> o_6;
  logical_and<unsigned_short> x_6;
  Message local_438;
  MPI_Op local_430;
  ompi_op_t *local_428;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_11;
  Message local_408;
  MPI_Datatype local_400;
  ompi_datatype_t *local_3f8;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_10;
  undefined1 local_3d8 [8];
  custom_op<unsigned_int,_true> o_5;
  logical_or<unsigned_int> x_5;
  Message local_388;
  MPI_Op local_380;
  ompi_op_t *local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_9;
  Message local_358;
  MPI_Datatype local_350;
  ompi_datatype_t *local_348;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_8;
  undefined1 local_328 [8];
  custom_op<unsigned_char,_true> o_4;
  bit_and<unsigned_char> x_4;
  Message local_2d8;
  MPI_Op local_2d0;
  ompi_op_t *local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_7;
  Message local_2a8;
  MPI_Datatype local_2a0;
  ompi_datatype_t *local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_6;
  undefined1 local_278 [8];
  custom_op<long,_true> o_3;
  bit_xor<long> x_3;
  Message local_228;
  MPI_Op local_220;
  ompi_op_t *local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_5;
  Message local_1f8;
  MPI_Datatype local_1f0;
  ompi_datatype_t *local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_4;
  undefined1 local_1c8 [8];
  custom_op<char,_true> o_2;
  bit_or<char> x_2;
  Message local_178;
  MPI_Op local_170;
  ompi_op_t *local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_3;
  Message local_148;
  MPI_Datatype local_140;
  ompi_datatype_t *local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_118 [8];
  custom_op<double,_true> o_1;
  multiplies<double> x_1;
  Message local_c8;
  MPI_Op local_c0;
  ompi_op_t *local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98 [3];
  MPI_Datatype local_80;
  ompi_datatype_t *local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  undefined1 local_58 [8];
  custom_op<int,_true> o;
  plus<int> x;
  MxxImpl_CustomOp_Test *this_local;
  
  mxx::custom_op<int,true>::custom_op<std::plus<int>>();
  local_78 = (ompi_datatype_t *)&ompi_mpi_int;
  local_80 = mxx::custom_op<int,_true>::get_type((custom_op<int,_true> *)local_58);
  testing::internal::EqHelper<false>::Compare<ompi_datatype_t*,ompi_datatype_t*>
            ((EqHelper<false> *)local_70,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_int))))","o.get_type()",
             &local_78,&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  local_b8 = (ompi_op_t *)&ompi_mpi_op_sum;
  local_c0 = mxx::custom_op<int,_true>::get_op((custom_op<int,_true> *)local_58);
  testing::internal::EqHelper<false>::Compare<ompi_op_t*,ompi_op_t*>
            ((EqHelper<false> *)local_b0,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_sum))))","o.get_op()",
             &local_b8,&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff30,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff30);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  mxx::custom_op<int,_true>::~custom_op((custom_op<int,_true> *)local_58);
  mxx::custom_op<double,true>::custom_op<std::multiplies<double>>();
  local_138 = (ompi_datatype_t *)&ompi_mpi_double;
  local_140 = mxx::custom_op<double,_true>::get_type((custom_op<double,_true> *)local_118);
  testing::internal::EqHelper<false>::Compare<ompi_datatype_t*,ompi_datatype_t*>
            ((EqHelper<false> *)local_130,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_double))))","o.get_type()"
             ,&local_138,&local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_168 = (ompi_op_t *)&ompi_mpi_op_prod;
  local_170 = mxx::custom_op<double,_true>::get_op((custom_op<double,_true> *)local_118);
  testing::internal::EqHelper<false>::Compare<ompi_op_t*,ompi_op_t*>
            ((EqHelper<false> *)local_160,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_prod))))","o.get_op()",
             &local_168,&local_170);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffe80,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe80);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  mxx::custom_op<double,_true>::~custom_op((custom_op<double,_true> *)local_118);
  mxx::custom_op<char,true>::custom_op<std::bit_or<char>>();
  local_1e8 = (ompi_datatype_t *)&ompi_mpi_char;
  local_1f0 = mxx::custom_op<char,_true>::get_type((custom_op<char,_true> *)local_1c8);
  testing::internal::EqHelper<false>::Compare<ompi_datatype_t*,ompi_datatype_t*>
            ((EqHelper<false> *)local_1e0,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_char))))","o.get_type()",
             &local_1e8,&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  local_218 = (ompi_op_t *)&ompi_mpi_op_bor;
  local_220 = mxx::custom_op<char,_true>::get_op((custom_op<char,_true> *)local_1c8);
  testing::internal::EqHelper<false>::Compare<ompi_op_t*,ompi_op_t*>
            ((EqHelper<false> *)local_210,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_bor))))","o.get_op()",
             &local_218,&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffdd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffdd0,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffdd0);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  mxx::custom_op<char,_true>::~custom_op((custom_op<char,_true> *)local_1c8);
  mxx::custom_op<long,true>::custom_op<std::bit_xor<long>>();
  local_298 = (ompi_datatype_t *)&ompi_mpi_long;
  local_2a0 = mxx::custom_op<long,_true>::get_type((custom_op<long,_true> *)local_278);
  testing::internal::EqHelper<false>::Compare<ompi_datatype_t*,ompi_datatype_t*>
            ((EqHelper<false> *)local_290,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_long))))","o.get_type()",
             &local_298,&local_2a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x37,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  local_2c8 = (ompi_op_t *)&ompi_mpi_op_bxor;
  local_2d0 = mxx::custom_op<long,_true>::get_op((custom_op<long,_true> *)local_278);
  testing::internal::EqHelper<false>::Compare<ompi_op_t*,ompi_op_t*>
            ((EqHelper<false> *)local_2c0,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_bxor))))","o.get_op()",
             &local_2c8,&local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffd20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffd20,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd20);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  mxx::custom_op<long,_true>::~custom_op((custom_op<long,_true> *)local_278);
  mxx::custom_op<unsigned_char,true>::custom_op<std::bit_and<unsigned_char>>();
  local_348 = (ompi_datatype_t *)&ompi_mpi_unsigned_char;
  local_350 = mxx::custom_op<unsigned_char,_true>::get_type
                        ((custom_op<unsigned_char,_true> *)local_328);
  testing::internal::EqHelper<false>::Compare<ompi_datatype_t*,ompi_datatype_t*>
            ((EqHelper<false> *)local_340,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_unsigned_char))))",
             "o.get_type()",&local_348,&local_350);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  local_378 = (ompi_op_t *)&ompi_mpi_op_band;
  local_380 = mxx::custom_op<unsigned_char,_true>::get_op
                        ((custom_op<unsigned_char,_true> *)local_328);
  testing::internal::EqHelper<false>::Compare<ompi_op_t*,ompi_op_t*>
            ((EqHelper<false> *)local_370,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_band))))","o.get_op()",
             &local_378,&local_380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffc70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffc70,&local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc70);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  mxx::custom_op<unsigned_char,_true>::~custom_op((custom_op<unsigned_char,_true> *)local_328);
  mxx::custom_op<unsigned_int,true>::custom_op<std::logical_or<unsigned_int>>();
  local_3f8 = (ompi_datatype_t *)&ompi_mpi_unsigned;
  local_400 = mxx::custom_op<unsigned_int,_true>::get_type
                        ((custom_op<unsigned_int,_true> *)local_3d8);
  testing::internal::EqHelper<false>::Compare<ompi_datatype_t*,ompi_datatype_t*>
            ((EqHelper<false> *)local_3f0,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_unsigned))))",
             "o.get_type()",&local_3f8,&local_400);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  local_428 = (ompi_op_t *)&ompi_mpi_op_lor;
  local_430 = mxx::custom_op<unsigned_int,_true>::get_op((custom_op<unsigned_int,_true> *)local_3d8)
  ;
  testing::internal::EqHelper<false>::Compare<ompi_op_t*,ompi_op_t*>
            ((EqHelper<false> *)local_420,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_lor))))","o.get_op()",
             &local_428,&local_430);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_438);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffbc0,&local_438);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc0);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  mxx::custom_op<unsigned_int,_true>::~custom_op((custom_op<unsigned_int,_true> *)local_3d8);
  mxx::custom_op<unsigned_short,true>::custom_op<std::logical_and<unsigned_short>>();
  local_4a8 = (ompi_datatype_t *)&ompi_mpi_unsigned_short;
  local_4b0 = mxx::custom_op<unsigned_short,_true>::get_type
                        ((custom_op<unsigned_short,_true> *)local_488);
  testing::internal::EqHelper<false>::Compare<ompi_datatype_t*,ompi_datatype_t*>
            ((EqHelper<false> *)local_4a0,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_unsigned_short))))",
             "o.get_type()",&local_4a8,&local_4b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
  if (!bVar1) {
    testing::Message::Message(&local_4b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
  local_4d8 = (ompi_op_t *)&ompi_mpi_op_land;
  local_4e0 = mxx::custom_op<unsigned_short,_true>::get_op
                        ((custom_op<unsigned_short,_true> *)local_488);
  testing::internal::EqHelper<false>::Compare<ompi_op_t*,ompi_op_t*>
            ((EqHelper<false> *)local_4d0,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_land))))","o.get_op()",
             &local_4d8,&local_4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&o_7.m_op,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&o_7.m_op,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&o_7.m_op);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
  mxx::custom_op<unsigned_short,_true>::~custom_op((custom_op<unsigned_short,_true> *)local_488);
  mxx::custom_op<float,true>::custom_op<float_const&(*)(float_const&,float_const&)>
            ((custom_op<float,true> *)&gtest_ar_14.message_,std::min<float>);
  local_548 = (ompi_datatype_t *)&ompi_mpi_float;
  local_550 = mxx::custom_op<float,_true>::get_type((custom_op<float,_true> *)&gtest_ar_14.message_)
  ;
  testing::internal::EqHelper<false>::Compare<ompi_datatype_t*,ompi_datatype_t*>
            ((EqHelper<false> *)local_540,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_float))))","o.get_type()",
             &local_548,&local_550);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar1) {
    testing::Message::Message(&local_558);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  local_578 = (ompi_op_t *)&ompi_mpi_op_min;
  local_580 = mxx::custom_op<float,_true>::get_op((custom_op<float,_true> *)&gtest_ar_14.message_);
  testing::internal::EqHelper<false>::Compare<ompi_op_t*,ompi_op_t*>
            ((EqHelper<false> *)local_570,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_min))))","o.get_op()",
             &local_578,&local_580);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
  if (!bVar1) {
    testing::Message::Message(&local_588);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&o_8.m_op,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&o_8.m_op,&local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&o_8.m_op);
    testing::Message::~Message(&local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
  mxx::custom_op<float,_true>::~custom_op((custom_op<float,_true> *)&gtest_ar_14.message_);
  mxx::custom_op<int,true>::custom_op<int_const&(*)(int_const&,int_const&)>
            ((custom_op<int,true> *)&gtest_ar_16.message_,std::max<int>);
  local_5e8 = (ompi_datatype_t *)&ompi_mpi_int;
  local_5f0 = mxx::custom_op<int,_true>::get_type((custom_op<int,_true> *)&gtest_ar_16.message_);
  testing::internal::EqHelper<false>::Compare<ompi_datatype_t*,ompi_datatype_t*>
            ((EqHelper<false> *)local_5e0,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_int))))","o.get_type()",
             &local_5e8,&local_5f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
  if (!bVar1) {
    testing::Message::Message(&local_5f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_5f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
  local_618 = (ompi_op_t *)&ompi_mpi_op_max;
  local_620 = mxx::custom_op<int,_true>::get_op((custom_op<int,_true> *)&gtest_ar_16.message_);
  testing::internal::EqHelper<false>::Compare<ompi_op_t*,ompi_op_t*>
            ((EqHelper<false> *)local_610,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_max))))","o.get_op()",
             &local_618,&local_620);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_610);
  if (!bVar1) {
    testing::Message::Message(&local_628);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_610);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffff9d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffff9d0,&local_628);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff9d0);
    testing::Message::~Message(&local_628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_610);
  mxx::custom_op<int,_true>::~custom_op((custom_op<int,_true> *)&gtest_ar_16.message_);
  mxx::custom_op<int,true>::custom_op<mxx::max<int>>();
  local_698 = (ompi_datatype_t *)&ompi_mpi_int;
  local_6a0 = mxx::custom_op<int,_true>::get_type((custom_op<int,_true> *)local_678);
  testing::internal::EqHelper<false>::Compare<ompi_datatype_t*,ompi_datatype_t*>
            ((EqHelper<false> *)local_690,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_int))))","o.get_type()",
             &local_698,&local_6a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_690);
  if (!bVar1) {
    testing::Message::Message(&local_6a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_690);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_6a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_6a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
  local_6c8 = (ompi_op_t *)&ompi_mpi_op_max;
  local_6d0 = mxx::custom_op<int,_true>::get_op((custom_op<int,_true> *)local_678);
  testing::internal::EqHelper<false>::Compare<ompi_op_t*,ompi_op_t*>
            ((EqHelper<false> *)local_6c0,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_max))))","o.get_op()",
             &local_6c8,&local_6d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c0);
  if (!bVar1) {
    testing::Message::Message(&local_6d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffff920,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffff920,&local_6d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff920);
    testing::Message::~Message(&local_6d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
  mxx::custom_op<int,_true>::~custom_op((custom_op<int,_true> *)local_678);
  mxx::custom_op<int,true>::custom_op<mxx::min<int>>();
  local_748 = (ompi_datatype_t *)&ompi_mpi_int;
  local_750 = mxx::custom_op<int,_true>::get_type((custom_op<int,_true> *)local_728);
  testing::internal::EqHelper<false>::Compare<ompi_datatype_t*,ompi_datatype_t*>
            ((EqHelper<false> *)local_740,
             "(static_cast<MPI_Datatype> (static_cast<void *> (&(ompi_mpi_int))))","o.get_type()",
             &local_748,&local_750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_740);
  if (!bVar1) {
    testing::Message::Message(&local_758);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_740);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
  local_778 = (ompi_op_t *)&ompi_mpi_op_min;
  local_780 = mxx::custom_op<int,_true>::get_op((custom_op<int,_true> *)local_728);
  testing::internal::EqHelper<false>::Compare<ompi_op_t*,ompi_op_t*>
            ((EqHelper<false> *)local_770,
             "(static_cast<MPI_Op> (static_cast<void *> (&(ompi_mpi_op_min))))","o.get_op()",
             &local_778,&local_780);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    testing::Message::Message(&local_788);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
    testing::internal::AssertHelper::AssertHelper
              (&local_790,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=(&local_790,&local_788);
    testing::internal::AssertHelper::~AssertHelper(&local_790);
    testing::Message::~Message(&local_788);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  mxx::custom_op<int,_true>::~custom_op((custom_op<int,_true> *)local_728);
  return;
}

Assistant:

TEST(MxxImpl, CustomOp) {
    // test C++ functors (postive tests)
    {
        std::plus<int> x;
        mxx::custom_op<int> o(x);
        EXPECT_EQ(MPI_INT, o.get_type());
        EXPECT_EQ(MPI_SUM, o.get_op());
    }
    {
        std::multiplies<double> x;
        mxx::custom_op<double> o(x);
        EXPECT_EQ(MPI_DOUBLE, o.get_type());
        EXPECT_EQ(MPI_PROD, o.get_op());
    }
    {
        std::bit_or<char> x;
        mxx::custom_op<char> o(x);
        EXPECT_EQ(MPI_CHAR, o.get_type());
        EXPECT_EQ(MPI_BOR, o.get_op());
    }
    {
        std::bit_xor<long> x;
        mxx::custom_op<long> o(x);
        EXPECT_EQ(MPI_LONG, o.get_type());
        EXPECT_EQ(MPI_BXOR, o.get_op());
    }
    {
        std::bit_and<unsigned char> x;
        mxx::custom_op<unsigned char> o(x);
        EXPECT_EQ(MPI_UNSIGNED_CHAR, o.get_type());
        EXPECT_EQ(MPI_BAND, o.get_op());
    }
    {
        std::logical_or<unsigned int> x;
        mxx::custom_op<unsigned int> o(x);
        EXPECT_EQ(MPI_UNSIGNED, o.get_type());
        EXPECT_EQ(MPI_LOR, o.get_op());
    }
    {
        std::logical_and<unsigned short> x;
        mxx::custom_op<unsigned short> o(x);
        EXPECT_EQ(MPI_UNSIGNED_SHORT, o.get_type());
        EXPECT_EQ(MPI_LAND, o.get_op());
    }
    // test std::min and std::max
    {
        mxx::custom_op<float> o(static_cast<const float&(*)(const float&, const float&)>(&std::min<float>));
        EXPECT_EQ(MPI_FLOAT, o.get_type());
        EXPECT_EQ(MPI_MIN, o.get_op());
    }
    {
        mxx::custom_op<int> o(static_cast<const int&(*)(const int&, const int&)>(&std::max<int>));
        EXPECT_EQ(MPI_INT, o.get_type());
        EXPECT_EQ(MPI_MAX, o.get_op());
    }
    {
        mxx::max<int> x;
        mxx::custom_op<int> o(x);
        EXPECT_EQ(MPI_INT, o.get_type());
        EXPECT_EQ(MPI_MAX, o.get_op());
    }
    {
        mxx::min<int> x;
        mxx::custom_op<int> o(x);
        EXPECT_EQ(MPI_INT, o.get_type());
        EXPECT_EQ(MPI_MIN, o.get_op());
    }
}